

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  char *__s;
  size_t sVar8;
  long *plVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  mapped_type *this_00;
  long lVar12;
  pointer piVar13;
  ulong uVar14;
  iterator __position;
  string *t;
  pointer pbVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  int retVal;
  string lcovFile;
  string nl;
  string lineNumber;
  string output;
  string actualSourceFile;
  string errors;
  string daGlob;
  string fileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string dir;
  string sourceFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string srcname;
  ostringstream cmCTestLog_msg_15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  covargs;
  string command;
  string st2lcovOutputRex3;
  string lcovCommand;
  ostringstream cmCTestLog_msg;
  string lcovExtraFlags;
  ostringstream cmCTestLog_msg_21;
  string testingDir;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  RegularExpression st2re3;
  bool local_a25;
  int local_a24;
  int local_a14;
  string *local_a10;
  char *local_a08;
  long local_a00;
  char local_9f8;
  undefined7 uStack_9f7;
  int local_9e4;
  string local_9e0;
  long *local_9c0 [2];
  long local_9b0 [2];
  string local_9a0;
  key_type local_980;
  int local_95c;
  string local_958;
  string local_938;
  string local_918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f8;
  undefined1 *local_8d8;
  pointer local_8d0;
  undefined1 local_8c8;
  undefined7 uStack_8c7;
  char *local_8b8;
  long local_8b0;
  char local_8a8;
  undefined7 uStack_8a7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_898;
  string local_880;
  string local_860;
  byte abStack_840 [80];
  ios_base local_7f0 [408];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  string local_620;
  long *local_600 [2];
  long local_5f0 [2];
  string local_5e0;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  byte abStack_5a0 [80];
  ios_base local_550 [408];
  string *local_3b8;
  pointer local_3b0;
  pointer local_3a8;
  TotalCoverageMap *local_3a0;
  pointer local_398;
  pointer local_390;
  string local_388;
  undefined1 local_368 [16];
  _func_int *local_358 [12];
  ios_base local_2f8 [264];
  string local_1f0;
  cmWorkingDirectory local_1d0;
  cmCTestCoverageHandlerLocale local_1a8;
  Glob local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  RegularExpression local_100;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_5c0._0_8_ = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"CoverageCommand","");
  cmCTest::GetCTestConfiguration(&local_5e0,pcVar1,(string *)local_5c0);
  if ((undefined1 *)local_5c0._0_8_ != local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0._0_8_ + 1);
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_5c0._0_8_ = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"CoverageExtraFlags","");
  cmCTest::GetCTestConfiguration(&local_388,pcVar1,(string *)local_5c0);
  if ((undefined1 *)local_5c0._0_8_ != local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0._0_8_ + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_5e0);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5c0," Not a valid Intel Coverage command.",0x24);
    std::ios::widen((char)(ostream *)local_5c0 + (char)*(undefined8 *)(local_5c0._0_8_ + -0x18));
    std::ostream::put((char)local_5c0);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x540,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
    std::ios_base::~ios_base(local_550);
    local_a24 = 0;
    goto LAB_005559c9;
  }
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"[0-9]+%","");
  plVar9 = local_600[0];
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  if (plVar9 != (long *)0x0) {
    cmsys::RegularExpression::compile(&local_100,(char *)plVar9);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5c0," This is coverage command: ",0x1b);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_5c0,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x549,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
  std::ios_base::~ios_base(local_550);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5c0," These are coverage command flags: ",0x23);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_5c0,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x54e,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
  std::ios_base::~ios_base(local_550);
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_898.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = FindLCovFiles(this,&local_898);
  if (bVar3) {
    if (local_898.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_898.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5c0," Cannot find any LCov coverage files.",0x25);
      std::ios::widen((char)(ostream *)local_5c0 + (char)*(undefined8 *)(local_5c0._0_8_ + -0x18));
      std::ostream::put((char)local_5c0);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x55a,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      goto LAB_0055589e;
    }
    cmCTest::GetBinaryDir_abi_cxx11_(&local_1f0,(this->super_cmCTestGenericHandler).CTest);
    local_130._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_130._M_impl.super__Rb_tree_header._M_header;
    local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    local_980._M_string_length = 0;
    local_980.field_2._M_local_buf[0] = '\0';
    local_130._M_impl.super__Rb_tree_header._M_header._M_right =
         local_130._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5c0,"   Processing coverage (each . represents one file):",0x34);
    std::ios::widen((char)(ostream *)local_5c0 + (char)*(undefined8 *)(local_5c0._0_8_ + -0x18));
    std::ostream::put((char)local_5c0);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x566,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
    std::ios_base::~ios_base(local_550);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,"    ",4);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x567,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
    std::ios_base::~ios_base(local_550);
    cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&local_1a8);
    cmSystemTools::ParseArguments(&local_638,&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&local_638,
             (const_iterator)
             local_638.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_5e0);
    joinCommandLine(&local_620,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_638.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_a10 = local_898.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3b8 = local_898.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_898.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_898.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_005558eb:
      local_a24 = 0;
    }
    else {
      local_3a0 = &cont->TotalCoverage;
      local_a24 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,".",1);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x577,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
        std::ios_base::~ios_base(local_550);
        cmsys::SystemTools::GetFilenamePath(&local_918,local_a10);
        cmWorkingDirectory::cmWorkingDirectory(&local_1d0,&local_918);
        if (local_1d0.ResultCode == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5c0,"Current coverage dir: ",0x16);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_5c0,local_918._M_dataplus._M_p,
                              local_918._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x585,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
          std::ios_base::~ios_base(local_550);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_5c0,local_620._M_dataplus._M_p,
                              local_620._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x587,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
          std::ios_base::~ios_base(local_550);
          local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
          local_9a0._M_string_length = 0;
          local_9a0.field_2._M_local_buf[0] = '\0';
          local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
          local_958._M_string_length = 0;
          local_958.field_2._M_local_buf[0] = '\0';
          local_a14 = 0;
          poVar7 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"* Run coverage for: ",0x14);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_918._M_dataplus._M_p,local_918._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          poVar7 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Command: ",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_620._M_dataplus._M_p,local_620._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          bVar3 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,&local_638,
                                      &local_9a0,&local_958,&local_a14,local_918._M_dataplus._M_p,
                                      (cmDuration)0x0,Auto);
          poVar7 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Output: ",10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          poVar7 = cont->OFS;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  Errors: ",10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_958._M_dataplus._M_p,local_958._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (bVar3) {
            if (local_a14 != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5c0,"Coverage command returned: ",0x1b);
              poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)local_5c0,local_a14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," while processing: ",0x13);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(local_a10->_M_dataplus)._M_p,local_a10->_M_string_length);
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x59f,local_860._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_860._M_dataplus._M_p != &local_860.field_2) {
                operator_delete(local_860._M_dataplus._M_p,
                                local_860.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5c0,"Command produced error: ",0x18);
              plVar9 = (long *)std::ostream::operator<<((ostringstream *)local_5c0,cont->Error);
              std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
              std::ostream::put((char)plVar9);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x5a1,local_860._M_dataplus._M_p,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_860._M_dataplus._M_p != &local_860.field_2) {
                operator_delete(local_860._M_dataplus._M_p,
                                local_860.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5c0,
                       "--------------------------------------------------------------",0x3e);
            cVar2 = (char)(ostringstream *)local_5c0;
            std::ios::widen((char)*(undefined8 *)(local_5c0._0_8_ + -0x18) + cVar2);
            std::ostream::put(cVar2);
            poVar7 = (ostream *)std::ostream::flush();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_9a0._M_dataplus._M_p,local_9a0._M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"--------------------------------------------------------------",0x3e)
            ;
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x5aa,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_860._M_dataplus._M_p != &local_860.field_2) {
              operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::SystemTools::Split(&local_9a0,&local_658);
            local_3b0 = local_658.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            pbVar10 = local_658.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_658.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_658.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_8b8 = &local_8a8;
                local_8b0 = 0;
                local_8a8 = '\0';
                local_a08 = &local_9f8;
                local_a00 = 0;
                local_9f8 = '\0';
                local_3a8 = pbVar10;
                cmsys::Glob::Glob(&local_188);
                local_188.Recurse = true;
                local_188.RecurseThroughSymlinks = false;
                local_8d8 = &local_8c8;
                local_8d0 = (pointer)0x0;
                local_8c8 = 0;
                local_8f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_8f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_8f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                cmCTest::GetBinaryDir_abi_cxx11_
                          ((string *)local_5c0,(this->super_cmCTestGenericHandler).CTest);
                std::__cxx11::string::operator=((string *)&local_8d8,(string *)local_5c0);
                if ((undefined1 *)local_5c0._0_8_ != local_5b0) {
                  operator_delete((void *)local_5c0._0_8_,local_5b0._0_8_ + 1);
                }
                local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                local_938._M_string_length = 0;
                local_938.field_2._M_local_buf[0] = '\0';
                local_5c0._0_8_ = local_8d0;
                local_5c0._8_8_ = local_8d8;
                local_5b0._0_8_ = 7;
                local_5b0._8_8_ = "/*.LCOV";
                views._M_len = 2;
                views._M_array = (iterator)local_5c0;
                cmCatViews_abi_cxx11_(&local_860,views);
                std::__cxx11::string::operator=((string *)&local_938,(string *)&local_860);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_860._M_dataplus._M_p != &local_860.field_2) {
                  operator_delete(local_860._M_dataplus._M_p,
                                  local_860.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_5c0,"   looking for LCOV files in: ",0x1e);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_5c0,local_938._M_dataplus._M_p,
                                    local_938._M_string_length);
                std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5c3,local_860._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_860._M_dataplus._M_p != &local_860.field_2) {
                  operator_delete(local_860._M_dataplus._M_p,
                                  local_860.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                std::ios_base::~ios_base(local_550);
                cmsys::Glob::FindFiles(&local_188,&local_938,(GlobMessages *)0x0);
                pvVar11 = cmsys::Glob::GetFiles_abi_cxx11_(&local_188);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_8f8,
                           local_8f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (pvVar11->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (pvVar11->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                local_9e4 = 0;
                local_398 = local_8f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                pbVar10 = local_8f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_8f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_8f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_a25 = true;
                }
                else {
                  do {
                    local_390 = pbVar10;
                    std::__cxx11::string::_M_assign((string *)&local_a08);
                    std::ifstream::ifstream((istream *)local_5c0,local_a08,_S_in);
                    if ((abStack_5a0[*(long *)(local_5c0._0_8_ + -0x18)] & 5) != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_860,"Cannot open file: ",0x12);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&local_860,local_a08,local_a00);
                      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                      std::ostream::put((char)poVar7);
                      std::ostream::flush();
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5cd,(char *)local_368._0_8_,false);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                      std::ios_base::~ios_base(local_7f0);
                    }
                    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
                    local_880._M_string_length = 0;
                    local_880.field_2._M_local_buf[0] = '\0';
                    local_a25 = cmsys::SystemTools::GetLineFromStream
                                          ((istream *)local_5c0,&local_880,(bool *)0x0,
                                           0xffffffffffffffff);
                    if (local_a25) {
                      std::__cxx11::string::substr((ulong)&local_860,(ulong)&local_880);
                      std::__cxx11::string::operator=((string *)&local_880,(string *)&local_860);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_860._M_dataplus._M_p != &local_860.field_2) {
                        operator_delete(local_860._M_dataplus._M_p,
                                        local_860.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::string::_M_assign((string *)&local_8b8);
                      std::__cxx11::string::_M_assign((string *)&local_980);
                      pbVar10 = local_8f8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      for (pbVar15 = local_8f8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar10;
                          pbVar15 = pbVar15 + 1) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_860,"Found LCOV File: ",0x11);
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&local_860,(pbVar15->_M_dataplus)._M_p,
                                            pbVar15->_M_string_length);
                        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                        std::ostream::put((char)poVar7);
                        std::ostream::flush();
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar1,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5e2,(char *)local_368._0_8_,
                                     (this->super_cmCTestGenericHandler).Quiet);
                        if ((_func_int **)local_368._0_8_ != local_358) {
                          operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                        std::ios_base::~ios_base(local_7f0);
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_860,"SourceFile: ",0xc);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&local_860,local_8b8,local_8b0);
                      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                      std::ostream::put((char)poVar7);
                      std::ostream::flush();
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5e6,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                      std::ios_base::~ios_base(local_7f0);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_860,"lCovFile: ",10);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&local_860,local_a08,local_a00);
                      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                      std::ostream::put((char)poVar7);
                      std::ostream::flush();
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5e8,(char *)local_368._0_8_,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                      std::ios_base::~ios_base(local_7f0);
                      if ((local_a00 != 0) && (local_980._M_string_length != 0)) {
                        this_00 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  ::operator[](local_3a0,&local_980);
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_860,"   in lcovFile: ",0x10);
                        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&local_860,local_a08,local_a00);
                        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                        std::ostream::put((char)poVar7);
                        std::ostream::flush();
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar1,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5f1,(char *)local_368._0_8_,
                                     (this->super_cmCTestGenericHandler).Quiet);
                        if ((_func_int **)local_368._0_8_ != local_358) {
                          operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                        std::ios_base::~ios_base(local_7f0);
                        std::ifstream::ifstream(&local_860,local_a08,_S_in);
                        if ((abStack_840[*(long *)(local_860._M_dataplus._M_p + -0x18)] & 5) == 0) {
                          local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
                          local_9e0._M_string_length = 0;
                          local_9e0.field_2._M_local_buf[0] = '\0';
                          cmsys::SystemTools::GetLineFromStream
                                    ((istream *)&local_860,&local_9e0,(bool *)0x0,0xffffffffffffffff
                                    );
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_368,"File is ready, start reading.",0x1d);
                          std::ios::widen((char)*(_func_int **)(local_368._0_8_ + -0x18) +
                                          (char)local_368);
                          std::ostream::put((char)local_368);
                          std::ostream::flush();
                          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                          std::__cxx11::stringbuf::str();
                          cmCTest::Log(pcVar1,5,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                       ,0x5fe,(char *)local_9c0[0],
                                       (this->super_cmCTestGenericHandler).Quiet);
                          if (local_9c0[0] != local_9b0) {
                            operator_delete(local_9c0[0],local_9b0[0] + 1);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                          std::ios_base::~ios_base(local_2f8);
                          while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                                   ((istream *)&local_860,&local_9e0,(bool *)0x0,
                                                    0xffffffffffffffff), bVar3) {
                            if (0xb < local_9e0._M_string_length) {
                              std::__cxx11::string::substr((ulong)local_368,(ulong)&local_9e0);
                              iVar4 = atoi((char *)local_368._0_8_);
                              std::__cxx11::string::substr((ulong)local_9c0,(ulong)&local_9e0);
                              plVar9 = local_9c0[0];
                              iVar5 = atoi((char *)local_9c0[0]);
                              if (0 < iVar5) {
                                uVar14 = (ulong)(iVar5 - 1);
                                piVar13 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start;
                                __position._M_current =
                                     (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish;
                                if ((ulong)((long)__position._M_current - (long)piVar13 >> 2) <=
                                    uVar14) {
                                  do {
                                    local_95c = -1;
                                    if (__position._M_current ==
                                        (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                                (this_00,__position,&local_95c);
                                      piVar13 = (this_00->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start;
                                      __position._M_current =
                                           (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish;
                                    }
                                    else {
                                      *__position._M_current = -1;
                                      __position._M_current = __position._M_current + 1;
                                      (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish =
                                           __position._M_current;
                                    }
                                  } while ((ulong)((long)__position._M_current - (long)piVar13 >> 2)
                                           <= uVar14);
                                }
                                iVar5 = piVar13[uVar14];
                                if (iVar5 < 0) {
                                  if (iVar4 < 1) {
                                    lVar12 = std::__cxx11::string::find((char)local_368,0x23);
                                    piVar13 = (this_00->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start;
                                    if (lVar12 == -1) {
                                      iVar5 = piVar13[uVar14];
                                      goto LAB_005550bf;
                                    }
                                  }
                                  piVar13[uVar14] = 0;
                                  iVar5 = 0;
                                }
LAB_005550bf:
                                piVar13[uVar14] = iVar5 + iVar4;
                                plVar9 = local_9c0[0];
                              }
                              if (plVar9 != local_9b0) {
                                operator_delete(plVar9,local_9b0[0] + 1);
                              }
                              if ((_func_int **)local_368._0_8_ != local_358) {
                                operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                              }
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                            operator_delete(local_9e0._M_dataplus._M_p,
                                            CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                     local_9e0.field_2._M_local_buf[0]) + 1);
                          }
                        }
                        else {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_368,"Cannot open file: ",0x12);
                          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_368,local_a08,local_a00);
                          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                          std::ostream::put((char)poVar7);
                          std::ostream::flush();
                          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                          std::__cxx11::stringbuf::str();
                          cmCTest::Log(pcVar1,7,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                       ,0x5f6,local_9e0._M_dataplus._M_p,false);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
                            operator_delete(local_9e0._M_dataplus._M_p,
                                            CONCAT71(local_9e0.field_2._M_allocated_capacity._1_7_,
                                                     local_9e0.field_2._M_local_buf[0]) + 1);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
                          std::ios_base::~ios_base(local_2f8);
                        }
                        local_980._M_string_length = 0;
                        *local_980._M_dataplus._M_p = '\0';
                        std::ifstream::~ifstream(&local_860);
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_860);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_860,"Error while parsing lcov file \'",0x1f);
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&local_860,local_a08,local_a00);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\':",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7," No source file name found!",0x1b);
                      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                      std::ostream::put((char)poVar7);
                      std::ostream::flush();
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,7,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d6,(char *)local_368._0_8_,false);
                      if ((_func_int **)local_368._0_8_ != local_358) {
                        operator_delete((void *)local_368._0_8_,(ulong)(local_358[0] + 1));
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_860);
                      std::ios_base::~ios_base(local_7f0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_880._M_dataplus._M_p != &local_880.field_2) {
                      operator_delete(local_880._M_dataplus._M_p,
                                      CONCAT71(local_880.field_2._M_allocated_capacity._1_7_,
                                               local_880.field_2._M_local_buf[0]) + 1);
                    }
                    std::ifstream::~ifstream(local_5c0);
                    if (!local_a25) {
                      local_9e4 = 1;
                      break;
                    }
                    pbVar10 = local_390 + 1;
                  } while (pbVar10 != local_398);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_938._M_dataplus._M_p != &local_938.field_2) {
                  operator_delete(local_938._M_dataplus._M_p,
                                  CONCAT71(local_938.field_2._M_allocated_capacity._1_7_,
                                           local_938.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_8f8);
                if (local_8d8 != &local_8c8) {
                  operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
                }
                cmsys::Glob::~Glob(&local_188);
                if (local_a08 != &local_9f8) {
                  operator_delete(local_a08,CONCAT71(uStack_9f7,local_9f8) + 1);
                }
                if (local_8b8 != &local_8a8) {
                  operator_delete(local_8b8,CONCAT71(uStack_8a7,local_8a8) + 1);
                }
                iVar4 = local_9e4;
                if (local_a25 == false) goto LAB_005556e6;
                pbVar10 = local_3a8 + 1;
              } while (pbVar10 != local_3b0);
            }
            iVar4 = local_a24 * -0x3d70a3d7;
            local_a24 = local_a24 + 1;
            uVar6 = iVar4 + 0xc7ae1479;
            iVar4 = 0;
            if ((uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f) < 0x51eb851) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5c0," processed: ",0xc);
              poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)local_5c0,local_a24);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," out of ",8);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x631,local_860._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_860._M_dataplus._M_p != &local_860.field_2) {
                operator_delete(local_860._M_dataplus._M_p,
                                local_860.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5c0,"    ",4);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x632,local_860._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_860._M_dataplus._M_p != &local_860.field_2) {
                operator_delete(local_860._M_dataplus._M_p,
                                local_860.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
              iVar4 = 0;
            }
LAB_005556e6:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5c0,"Problem running coverage on file: ",0x22);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_5c0,(local_a10->_M_dataplus)._M_p,
                                local_a10->_M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x596,local_860._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_860._M_dataplus._M_p != &local_860.field_2) {
              operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5c0,"Command produced error: ",0x18);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_5c0,local_958._M_dataplus._M_p,
                                local_958._M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x598,local_860._M_dataplus._M_p,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_860._M_dataplus._M_p != &local_860.field_2) {
              operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            cont->Error = cont->Error + 1;
            iVar4 = 0x11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_dataplus._M_p != &local_958.field_2) {
            operator_delete(local_958._M_dataplus._M_p,
                            CONCAT71(local_958.field_2._M_allocated_capacity._1_7_,
                                     local_958.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
            operator_delete(local_9a0._M_dataplus._M_p,
                            CONCAT71(local_9a0.field_2._M_allocated_capacity._1_7_,
                                     local_9a0.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_5c0,"Unable to change working directory to ",0x26);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_5c0,local_918._M_dataplus._M_p,
                              local_918._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
          __s = strerror(local_1d0.ResultCode);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
          }
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x57e,local_860._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
          std::ios_base::~ios_base(local_550);
          cont->Error = cont->Error + 1;
          iVar4 = 0x11;
        }
        cmWorkingDirectory::~cmWorkingDirectory(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918._M_dataplus._M_p != &local_918.field_2) {
          operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
        }
        if ((iVar4 != 0x11) && (iVar4 != 0)) goto LAB_005558eb;
        local_a10 = local_a10 + 1;
      } while (local_a10 != local_3b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_638);
    cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,
                      CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                               local_980.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5c0,"Error while finding LCov files.\n",0x20);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x553,local_860._M_dataplus._M_p,false);
LAB_0055589e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
    std::ios_base::~ios_base(local_550);
    local_a24 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_898);
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
LAB_005559c9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  return local_a24;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  std::vector<std::string> covargs =
    cmSystemTools::ParseArguments(lcovExtraFlags);
  covargs.insert(covargs.begin(), lcovCommand);
  const std::string command = joinCommandLine(covargs);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (std::string const& f : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(f);
    cmWorkingDirectory workdir(fileDir);
    if (workdir.Failed()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to change working directory to "
                   << fileDir << " : "
                   << std::strerror(workdir.GetLastResult()) << std::endl);
      cont->Error++;
      continue;
    }

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(covargs, &output, &errors, &retVal,
                                      fileDir.c_str(),
                                      cmDuration::zero() /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Coverage command returned: "
                   << retVal << " while processing: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    cmsys::SystemTools::Split(output, lines);

    for (std::string const& line : lines) {
      std::string sourceFile;
      std::string lcovFile;

      if (line.empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = cmStrCat(dir, "/*.LCOV");
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      cm::append(lcovFiles, gl.GetFiles());

      for (std::string const& file : lcovFiles) {
        lcovFile = file;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::string const& t : lcovFiles) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile.clear();
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}